

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

void duckdb::CheckDirectory(FileSystem *fs,string *file_path,CopyOverwriteMode overwrite_mode)

{
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  reference pvVar4;
  NotImplementedException *this;
  IOException *this_00;
  iterator __begin2;
  long lVar5;
  size_type __n;
  value_type directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  directory_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  file_list;
  string local_d8;
  long local_b8;
  long lStack_b0;
  undefined8 local_a8;
  long local_98;
  long lStack_90;
  undefined8 local_88;
  string *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((overwrite_mode & ~COPY_OVERWRITE) != COPY_OVERWRITE_OR_IGNORE) {
    bVar3 = FileSystem::IsRemoteFile((string *)file_path);
    if (overwrite_mode == COPY_OVERWRITE && bVar3) {
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"OVERWRITE is not supported for remote file systems","");
      NotImplementedException::NotImplementedException(this,&local_d8);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_98 = 0;
    lStack_90 = 0;
    local_88 = 0;
    local_a8 = 0;
    local_b8 = 0;
    lStack_b0 = 0;
    local_78 = file_path;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8,file_path);
    if (lStack_b0 != local_b8) {
      __n = 0;
      do {
        pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)&local_b8,__n);
        pcVar1 = (pvVar4->_M_dataplus)._M_p;
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar1,pcVar1 + pvVar4->_M_string_length);
        local_68 = 0;
        local_70 = (undefined8 *)operator_new(0x20);
        *local_70 = fs;
        local_70[1] = &local_d8;
        local_70[2] = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_b8;
        local_70[3] = &local_98;
        local_58 = ::std::
                   _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/execution/operator/persistent/physical_copy_to_file.cpp:379:27)>
                   ::_M_invoke;
        local_60 = ::std::
                   _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/execution/operator/persistent/physical_copy_to_file.cpp:379:27)>
                   ::_M_manager;
        (*fs->_vptr_FileSystem[0x11])(fs,&local_d8,&local_70,0);
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        __n = __n + 1;
      } while (__n < (ulong)(lStack_b0 - local_b8 >> 5));
    }
    lVar2 = lStack_90;
    if (local_98 != lStack_90) {
      lVar5 = local_98;
      if (overwrite_mode != COPY_OVERWRITE) {
        this_00 = (IOException *)__cxa_allocate_exception(0x10);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,
                   "Directory \"%s\" is not empty! Enable OVERWRITE option to overwrite files","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar1 = (local_78->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + local_78->_M_string_length);
        IOException::IOException<std::__cxx11::string>(this_00,(string *)&local_d8,&local_50);
        __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      do {
        (*fs->_vptr_FileSystem[0x15])(fs,lVar5,0);
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != lVar2);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_b8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98);
  }
  return;
}

Assistant:

void CheckDirectory(FileSystem &fs, const string &file_path, CopyOverwriteMode overwrite_mode) {
	if (overwrite_mode == CopyOverwriteMode::COPY_OVERWRITE_OR_IGNORE ||
	    overwrite_mode == CopyOverwriteMode::COPY_APPEND) {
		// with overwrite or ignore we fully ignore the presence of any files instead of erasing them
		return;
	}
	if (fs.IsRemoteFile(file_path) && overwrite_mode == CopyOverwriteMode::COPY_OVERWRITE) {
		// we can only remove files for local file systems currently
		// as remote file systems (e.g. S3) do not support RemoveFile
		throw NotImplementedException("OVERWRITE is not supported for remote file systems");
	}
	vector<string> file_list;
	vector<string> directory_list;
	directory_list.push_back(file_path);
	for (idx_t dir_idx = 0; dir_idx < directory_list.size(); dir_idx++) {
		auto directory = directory_list[dir_idx];
		fs.ListFiles(directory, [&](const string &path, bool is_directory) {
			auto full_path = fs.JoinPath(directory, path);
			if (is_directory) {
				directory_list.emplace_back(std::move(full_path));
			} else {
				file_list.emplace_back(std::move(full_path));
			}
		});
	}
	if (file_list.empty()) {
		return;
	}
	if (overwrite_mode == CopyOverwriteMode::COPY_OVERWRITE) {
		for (auto &file : file_list) {
			fs.RemoveFile(file);
		}
	} else {
		throw IOException("Directory \"%s\" is not empty! Enable OVERWRITE option to overwrite files", file_path);
	}
}